

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.h
# Opt level: O0

int tcmalloc::CreateTlsKey(TlsKey *pkey,_func_void_void_ptr *destructor)

{
  int err;
  _func_void_void_ptr *destructor_local;
  TlsKey *pkey_local;
  
  pkey_local._4_4_ = pthread_key_create(pkey,(__destr_function *)destructor);
  if (pkey_local._4_4_ == 0) {
    if (*pkey == 0xffffffff) {
      pkey_local._4_4_ = CreateTlsKey(pkey,destructor);
    }
    else {
      pkey_local._4_4_ = 0;
    }
  }
  return pkey_local._4_4_;
}

Assistant:

ATTRIBUTE_VISIBILITY_HIDDEN inline int CreateTlsKey(TlsKey *pkey, void (*destructor)(void*)) {
  int err = pthread_key_create(pkey, destructor);
  if (err != 0) {
    return err;
  }
  // It is super-implausible that we'll be able to create "invalid"
  // tls key value, but just in case, we check and re-create if we end
  // up getting one.
  if (*pkey != kInvalidTLSKey) {
    return 0;
  }

  return CreateTlsKey(pkey, destructor);
}